

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O2

void __thiscall
my_algorithm::SymbolPairChecker::SymbolPairChecker
          (SymbolPairChecker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *symbol_pairs)

{
  ListNode<char> **ppLVar1;
  Stack<char> local_58;
  
  this->_vptr_SymbolPairChecker = (_func_int **)&PTR__SymbolPairChecker_0010bcf8;
  (this->_open_symbols)._M_dataplus._M_p = (pointer)&(this->_open_symbols).field_2;
  (this->_open_symbols)._M_string_length = 0;
  (this->_open_symbols).field_2._M_local_buf[0] = '\0';
  (this->_close_symbols)._M_dataplus._M_p = (pointer)&(this->_close_symbols).field_2;
  (this->_close_symbols)._M_string_length = 0;
  (this->_close_symbols).field_2._M_local_buf[0] = '\0';
  data_structures::Stack<char>::Stack(&this->_stack);
  this->_cursor = 0;
  ppLVar1 = &local_58._list._header;
  local_58._list._vptr_LinkedList = (_func_int **)0x0;
  local_58._list._header._0_1_ = 0;
  local_58._vptr_Stack = (_func_int **)ppLVar1;
  std::__cxx11::string::operator=((string *)&this->_open_symbols,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._list._vptr_LinkedList = (_func_int **)0x0;
  local_58._list._header._0_1_ = 0;
  local_58._vptr_Stack = (_func_int **)ppLVar1;
  std::__cxx11::string::operator=((string *)&this->_close_symbols,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  setSymbolPairs(this,symbol_pairs);
  data_structures::Stack<char>::Stack(&local_58);
  data_structures::LinkedList<char>::operator=(&(this->_stack)._list,&local_58._list);
  data_structures::Stack<char>::~Stack(&local_58);
  return;
}

Assistant:

SymbolPairChecker::SymbolPairChecker(const std::vector<std::string>& symbol_pairs) {
        _cursor = 0;
        _open_symbols = std::string();
        _close_symbols = std::string();
        setSymbolPairs(symbol_pairs);
        _stack = data_structures::Stack<char>();
    }